

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O3

int alignSeq(string *a,string *b)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  pointer pvVar4;
  uint uVar5;
  uint uVar6;
  pointer pcVar7;
  pointer pcVar8;
  pointer piVar9;
  pointer *ppiVar10;
  pointer piVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  m;
  allocator_type local_8a;
  allocator_type local_89;
  ulong local_88;
  string *local_80;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_78;
  string *local_60;
  ulong local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar5 = (uint)a->_M_string_length;
  uVar6 = (uint)b->_M_string_length;
  uVar1 = uVar6 + 1;
  local_80 = a;
  local_60 = b;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)(int)uVar1,&local_89);
  uVar2 = uVar5 + 1;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_78,(long)(int)uVar2,&local_48,&local_8a);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (uVar5 < 0x7fffffff) {
    lVar15 = ((long)local_78.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_78.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    ppiVar10 = &((local_78.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish;
    uVar19 = 0;
    do {
      if (lVar15 - uVar19 == 0) {
LAB_00181405:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   lVar15);
      }
      if (*ppiVar10 == ((_Vector_impl_data *)(ppiVar10 + -1))->_M_start) {
        lVar15 = 0;
        goto LAB_00181405;
      }
      *((_Vector_impl_data *)(ppiVar10 + -1))->_M_start = 0;
      uVar19 = uVar19 + 1;
      ppiVar10 = ppiVar10 + 3;
    } while (uVar2 != uVar19);
  }
  if (uVar6 < 0x7fffffff) {
    if (local_78.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_78.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar15 = 0;
LAB_0018141f:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",lVar15)
      ;
    }
    piVar11 = ((local_78.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start;
    lVar15 = (long)((local_78.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                   _M_finish - (long)piVar11 >> 2;
    lVar20 = 0;
    do {
      if (lVar15 + lVar20 == 0) goto LAB_0018141f;
      *piVar11 = (int)lVar20;
      lVar20 = lVar20 + -1;
      piVar11 = piVar11 + 1;
    } while (-lVar20 != (ulong)uVar1);
  }
  iVar24 = 0;
  if (1 < (int)uVar2) {
    local_88 = local_80->_M_string_length;
    local_58 = (ulong)uVar2;
    local_50 = (ulong)uVar1 - 1;
    iVar24 = 0;
    uVar19 = 1;
    do {
      if (1 < (int)uVar1) {
        uVar3 = uVar19 - 1;
        uVar16 = local_88;
        uVar22 = uVar3;
        if (local_88 <= uVar3) {
LAB_001813ab:
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar22,
                     uVar16);
        }
        uVar12 = ((long)local_78.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_78.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        pcVar7 = (local_60->_M_dataplus)._M_p;
        uVar16 = local_60->_M_string_length;
        pcVar8 = (local_80->_M_dataplus)._M_p;
        pvVar4 = local_78.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar19;
        uVar13 = 0;
        do {
          uVar22 = uVar16;
          if (uVar16 == uVar13) goto LAB_001813ab;
          uVar22 = uVar12;
          uVar21 = uVar3;
          if (uVar12 < uVar3 || uVar12 - uVar3 == 0) {
LAB_001813f2:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar21,uVar22);
          }
          piVar11 = pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar22 = (long)pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar11 >> 2;
          uVar21 = uVar13;
          if (uVar22 <= uVar13) goto LAB_001813f2;
          uVar21 = uVar13 + 1;
          if (uVar22 <= uVar21) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar21,uVar22);
          }
          uVar22 = uVar19;
          uVar23 = uVar12;
          if (uVar12 < uVar19 || uVar12 - uVar19 == 0) {
LAB_001813c4:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar22,uVar23);
          }
          piVar9 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar23 = (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar9 >> 2;
          uVar22 = uVar13;
          if ((uVar23 <= uVar13) || (uVar22 = uVar21, uVar23 <= uVar21)) goto LAB_001813c4;
          iVar14 = (uint)(pcVar8[uVar3] == pcVar7[uVar13]) * 2 + -1 + piVar11[uVar13];
          iVar17 = piVar9[uVar13];
          if (piVar9[uVar13] < piVar11[uVar13 + 1]) {
            iVar17 = piVar11[uVar13 + 1];
          }
          iVar18 = iVar17 + -1;
          if (iVar17 + -1 < iVar14) {
            iVar18 = iVar14;
          }
          piVar9[uVar13 + 1] = iVar18;
          if (iVar18 < iVar24) {
            iVar18 = iVar24;
          }
          iVar24 = iVar18;
          uVar13 = uVar13 + 1;
        } while (local_50 != uVar13);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != local_58);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_78);
  return iVar24;
}

Assistant:

int alignSeq(const std::string &a, const std::string &b)
{
	int rows = a.size() + 1;
	int cols = b.size() + 1;

	std::vector<std::vector<int>> m(rows, std::vector<int>(cols));
	int maxScore = 0;
	for (int i = 0; i < rows; ++i)
		m.at(i).at(0) = 0;
	for (int j = 0; j < cols; ++j)
		m.at(0).at(j) = j * GAP_PENALTY;
	for (int i = 1; i < rows; ++i)
	{
		for (int j = 1; j < cols; ++j)
		{
			int sim = a.at(i - 1) == b.at(j - 1) ? MATCH_SCORE : MIS_MATCH_SCORE;
			m.at(i).at(j) = std::max(sim + m.at(i - 1).at(j - 1),
									 std::max(GAP_PENALTY + m.at(i - 1).at(j), GAP_PENALTY + m.at(i).at(j - 1)));
			maxScore = std::max(maxScore, m.at(i).at(j));
		}
	}
	return maxScore;
}